

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

bool __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::insert_no_grow(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
                 *this,insert_result *result,block *k,empty_type *v)

{
  raw_node *prVar1;
  bool bVar2;
  uint uVar3;
  color_quad_u8 *pDst;
  uint uVar4;
  ulong uVar5;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar3 = hash_key(this,k);
  prVar1 = (this->m_values).m_p;
  pDst = (color_quad_u8 *)(prVar1 + uVar3);
  uVar4 = uVar3;
  if (prVar1[uVar3].m_bits[0x41] == '\0') {
LAB_00106411:
    if (this->m_grow_threshold <= this->m_num_valid) {
      return false;
    }
    construct_value_type((value_type *)pDst,k,v);
    *(undefined1 *)((long)(pDst + 0x10) + 1) = 1;
    this->m_num_valid = this->m_num_valid + 1;
    bVar2 = true;
  }
  else {
    bVar2 = crn::block::operator==((block *)pDst,k);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      uVar5 = (ulong)uVar3;
      do {
        if ((int)uVar5 == 0) {
          uVar5 = (ulong)((this->m_values).m_size - 1);
          pDst = (color_quad_u8 *)((this->m_values).m_p + uVar5);
        }
        else {
          uVar5 = (ulong)((int)uVar5 - 1);
          pDst = pDst + -0x11;
        }
        uVar4 = (uint)uVar5;
        if (uVar3 == uVar4) {
          return false;
        }
        if (*(char *)((long)(pDst + 0x10) + 1) == '\0') goto LAB_00106411;
        bVar2 = crn::block::operator==((block *)pDst,k);
      } while (!bVar2);
      bVar2 = false;
    }
  }
  (result->first).m_pTable = this;
  (result->first).m_index = uVar4;
  result->second = bVar2;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }